

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O3

expected<const_Command::Arg_*,_Commands::MatchFailure> *
make_expected_error(expected<const_Command::Arg_*,_Commands::MatchFailure> *__return_storage_ptr__,
                   shared_ptr<const_SyntaxTree> *hint,Arg *arginfo)

{
  expected<const_Command::Arg_*,_Commands::MatchFailure> *peVar1;
  expected<const_Command::Arg_*,_Commands::MatchFailure> *extraout_RAX;
  unreachable_exception *this;
  byte in_CL;
  
  if (8 < in_CL) {
    this = (unreachable_exception *)__cxa_allocate_exception(0x10);
    unreachable_exception::unreachable_exception
              (this,
               "Unreachable code reached at /workspace/llm4binary/github/license_all_cmakelists_1510/AndroidModLoader[P]gta3sc/src/commands.cpp(239)."
              );
    __cxa_throw(this,&unreachable_exception::typeinfo,std::runtime_error::~runtime_error);
  }
  peVar1 = (expected<const_Command::Arg_*,_Commands::MatchFailure> *)
           ((long)&switchD_00164f08::switchdataD_001de1cc +
           (long)(int)(&switchD_00164f08::switchdataD_001de1cc)[in_CL]);
  switch(in_CL) {
  case 0:
    break;
  case 1:
    if (arginfo == (Arg *)0x0) {
      __return_storage_ptr__->has_value = false;
      (__return_storage_ptr__->contained).m_value = (value_type)hint;
      (__return_storage_ptr__->contained).m_error.context.
      super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (__return_storage_ptr__->contained).m_error.reason = NoSuchLabel;
      return peVar1;
    }
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&(arginfo->enums).
               super__Vector_base<std::shared_ptr<Enum>,_std::allocator<std::shared_ptr<Enum>_>_>.
               _M_impl.super__Vector_impl_data._M_start =
           *(int *)&(arginfo->enums).
                    super__Vector_base<std::shared_ptr<Enum>,_std::allocator<std::shared_ptr<Enum>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 1;
      UNLOCK();
      if (__libc_single_threaded != '\0') goto LAB_0016516b;
      LOCK();
      *(int *)&(arginfo->enums).
               super__Vector_base<std::shared_ptr<Enum>,_std::allocator<std::shared_ptr<Enum>_>_>.
               _M_impl.super__Vector_impl_data._M_start =
           *(int *)&(arginfo->enums).
                    super__Vector_base<std::shared_ptr<Enum>,_std::allocator<std::shared_ptr<Enum>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 1;
      UNLOCK();
    }
    else {
      *(int *)&(arginfo->enums).
               super__Vector_base<std::shared_ptr<Enum>,_std::allocator<std::shared_ptr<Enum>_>_>.
               _M_impl.super__Vector_impl_data._M_start =
           *(int *)&(arginfo->enums).
                    super__Vector_base<std::shared_ptr<Enum>,_std::allocator<std::shared_ptr<Enum>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 1;
LAB_0016516b:
      *(int *)&(arginfo->enums).
               super__Vector_base<std::shared_ptr<Enum>,_std::allocator<std::shared_ptr<Enum>_>_>.
               _M_impl.super__Vector_impl_data._M_start =
           *(int *)&(arginfo->enums).
                    super__Vector_base<std::shared_ptr<Enum>,_std::allocator<std::shared_ptr<Enum>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 1;
    }
    __return_storage_ptr__->has_value = false;
    (__return_storage_ptr__->contained).m_value = (value_type)hint;
    (__return_storage_ptr__->contained).m_error.context.
    super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)arginfo;
    (__return_storage_ptr__->contained).m_error.reason = NoSuchLabel;
    goto LAB_001651a0;
  case 2:
    if (arginfo == (Arg *)0x0) {
      __return_storage_ptr__->has_value = false;
      (__return_storage_ptr__->contained).m_value = (value_type)hint;
      (__return_storage_ptr__->contained).m_error.context.
      super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (__return_storage_ptr__->contained).m_error.reason = ExpectedInt;
      return peVar1;
    }
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&(arginfo->enums).
               super__Vector_base<std::shared_ptr<Enum>,_std::allocator<std::shared_ptr<Enum>_>_>.
               _M_impl.super__Vector_impl_data._M_start =
           *(int *)&(arginfo->enums).
                    super__Vector_base<std::shared_ptr<Enum>,_std::allocator<std::shared_ptr<Enum>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 1;
      UNLOCK();
      if (__libc_single_threaded != '\0') goto LAB_00165100;
      LOCK();
      *(int *)&(arginfo->enums).
               super__Vector_base<std::shared_ptr<Enum>,_std::allocator<std::shared_ptr<Enum>_>_>.
               _M_impl.super__Vector_impl_data._M_start =
           *(int *)&(arginfo->enums).
                    super__Vector_base<std::shared_ptr<Enum>,_std::allocator<std::shared_ptr<Enum>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 1;
      UNLOCK();
    }
    else {
      *(int *)&(arginfo->enums).
               super__Vector_base<std::shared_ptr<Enum>,_std::allocator<std::shared_ptr<Enum>_>_>.
               _M_impl.super__Vector_impl_data._M_start =
           *(int *)&(arginfo->enums).
                    super__Vector_base<std::shared_ptr<Enum>,_std::allocator<std::shared_ptr<Enum>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 1;
LAB_00165100:
      *(int *)&(arginfo->enums).
               super__Vector_base<std::shared_ptr<Enum>,_std::allocator<std::shared_ptr<Enum>_>_>.
               _M_impl.super__Vector_impl_data._M_start =
           *(int *)&(arginfo->enums).
                    super__Vector_base<std::shared_ptr<Enum>,_std::allocator<std::shared_ptr<Enum>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 1;
    }
    __return_storage_ptr__->has_value = false;
    (__return_storage_ptr__->contained).m_value = (value_type)hint;
    (__return_storage_ptr__->contained).m_error.context.
    super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)arginfo;
    (__return_storage_ptr__->contained).m_error.reason = ExpectedInt;
    goto LAB_001651a0;
  case 3:
    if (arginfo == (Arg *)0x0) {
      __return_storage_ptr__->has_value = false;
      (__return_storage_ptr__->contained).m_value = (value_type)hint;
      (__return_storage_ptr__->contained).m_error.context.
      super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (__return_storage_ptr__->contained).m_error.reason = ExpectedFloat;
      return peVar1;
    }
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&(arginfo->enums).
               super__Vector_base<std::shared_ptr<Enum>,_std::allocator<std::shared_ptr<Enum>_>_>.
               _M_impl.super__Vector_impl_data._M_start =
           *(int *)&(arginfo->enums).
                    super__Vector_base<std::shared_ptr<Enum>,_std::allocator<std::shared_ptr<Enum>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 1;
      UNLOCK();
      if (__libc_single_threaded != '\0') goto LAB_00165127;
      LOCK();
      *(int *)&(arginfo->enums).
               super__Vector_base<std::shared_ptr<Enum>,_std::allocator<std::shared_ptr<Enum>_>_>.
               _M_impl.super__Vector_impl_data._M_start =
           *(int *)&(arginfo->enums).
                    super__Vector_base<std::shared_ptr<Enum>,_std::allocator<std::shared_ptr<Enum>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 1;
      UNLOCK();
    }
    else {
      *(int *)&(arginfo->enums).
               super__Vector_base<std::shared_ptr<Enum>,_std::allocator<std::shared_ptr<Enum>_>_>.
               _M_impl.super__Vector_impl_data._M_start =
           *(int *)&(arginfo->enums).
                    super__Vector_base<std::shared_ptr<Enum>,_std::allocator<std::shared_ptr<Enum>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 1;
LAB_00165127:
      *(int *)&(arginfo->enums).
               super__Vector_base<std::shared_ptr<Enum>,_std::allocator<std::shared_ptr<Enum>_>_>.
               _M_impl.super__Vector_impl_data._M_start =
           *(int *)&(arginfo->enums).
                    super__Vector_base<std::shared_ptr<Enum>,_std::allocator<std::shared_ptr<Enum>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 1;
    }
    __return_storage_ptr__->has_value = false;
    (__return_storage_ptr__->contained).m_value = (value_type)hint;
    (__return_storage_ptr__->contained).m_error.context.
    super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)arginfo;
    (__return_storage_ptr__->contained).m_error.reason = ExpectedFloat;
    goto LAB_001651a0;
  default:
    if (arginfo == (Arg *)0x0) {
      __return_storage_ptr__->has_value = false;
      (__return_storage_ptr__->contained).m_value = (value_type)hint;
      (__return_storage_ptr__->contained).m_error.context.
      super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (__return_storage_ptr__->contained).m_error.reason = ExpectedTextLabel;
      return peVar1;
    }
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&(arginfo->enums).
               super__Vector_base<std::shared_ptr<Enum>,_std::allocator<std::shared_ptr<Enum>_>_>.
               _M_impl.super__Vector_impl_data._M_start =
           *(int *)&(arginfo->enums).
                    super__Vector_base<std::shared_ptr<Enum>,_std::allocator<std::shared_ptr<Enum>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 1;
      UNLOCK();
      if (__libc_single_threaded != '\0') goto LAB_00165034;
      LOCK();
      *(int *)&(arginfo->enums).
               super__Vector_base<std::shared_ptr<Enum>,_std::allocator<std::shared_ptr<Enum>_>_>.
               _M_impl.super__Vector_impl_data._M_start =
           *(int *)&(arginfo->enums).
                    super__Vector_base<std::shared_ptr<Enum>,_std::allocator<std::shared_ptr<Enum>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 1;
      UNLOCK();
    }
    else {
      *(int *)&(arginfo->enums).
               super__Vector_base<std::shared_ptr<Enum>,_std::allocator<std::shared_ptr<Enum>_>_>.
               _M_impl.super__Vector_impl_data._M_start =
           *(int *)&(arginfo->enums).
                    super__Vector_base<std::shared_ptr<Enum>,_std::allocator<std::shared_ptr<Enum>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 1;
LAB_00165034:
      *(int *)&(arginfo->enums).
               super__Vector_base<std::shared_ptr<Enum>,_std::allocator<std::shared_ptr<Enum>_>_>.
               _M_impl.super__Vector_impl_data._M_start =
           *(int *)&(arginfo->enums).
                    super__Vector_base<std::shared_ptr<Enum>,_std::allocator<std::shared_ptr<Enum>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 1;
    }
    __return_storage_ptr__->has_value = false;
    (__return_storage_ptr__->contained).m_value = (value_type)hint;
    (__return_storage_ptr__->contained).m_error.context.
    super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)arginfo;
    (__return_storage_ptr__->contained).m_error.reason = ExpectedTextLabel;
    goto LAB_001651a0;
  case 6:
  case 7:
    if (arginfo == (Arg *)0x0) {
      __return_storage_ptr__->has_value = false;
      (__return_storage_ptr__->contained).m_value = (value_type)hint;
      (__return_storage_ptr__->contained).m_error.context.
      super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (__return_storage_ptr__->contained).m_error.reason = ExpectedStringLiteral;
      return peVar1;
    }
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&(arginfo->enums).
               super__Vector_base<std::shared_ptr<Enum>,_std::allocator<std::shared_ptr<Enum>_>_>.
               _M_impl.super__Vector_impl_data._M_start =
           *(int *)&(arginfo->enums).
                    super__Vector_base<std::shared_ptr<Enum>,_std::allocator<std::shared_ptr<Enum>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 1;
      UNLOCK();
      if (__libc_single_threaded != '\0') goto LAB_0016505b;
      LOCK();
      *(int *)&(arginfo->enums).
               super__Vector_base<std::shared_ptr<Enum>,_std::allocator<std::shared_ptr<Enum>_>_>.
               _M_impl.super__Vector_impl_data._M_start =
           *(int *)&(arginfo->enums).
                    super__Vector_base<std::shared_ptr<Enum>,_std::allocator<std::shared_ptr<Enum>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 1;
      UNLOCK();
    }
    else {
      *(int *)&(arginfo->enums).
               super__Vector_base<std::shared_ptr<Enum>,_std::allocator<std::shared_ptr<Enum>_>_>.
               _M_impl.super__Vector_impl_data._M_start =
           *(int *)&(arginfo->enums).
                    super__Vector_base<std::shared_ptr<Enum>,_std::allocator<std::shared_ptr<Enum>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 1;
LAB_0016505b:
      *(int *)&(arginfo->enums).
               super__Vector_base<std::shared_ptr<Enum>,_std::allocator<std::shared_ptr<Enum>_>_>.
               _M_impl.super__Vector_impl_data._M_start =
           *(int *)&(arginfo->enums).
                    super__Vector_base<std::shared_ptr<Enum>,_std::allocator<std::shared_ptr<Enum>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 1;
    }
    __return_storage_ptr__->has_value = false;
    (__return_storage_ptr__->contained).m_value = (value_type)hint;
    (__return_storage_ptr__->contained).m_error.context.
    super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)arginfo;
    (__return_storage_ptr__->contained).m_error.reason = ExpectedStringLiteral;
    goto LAB_001651a0;
  case 8:
    if (arginfo == (Arg *)0x0) {
      __return_storage_ptr__->has_value = false;
      (__return_storage_ptr__->contained).m_value = (value_type)hint;
      (__return_storage_ptr__->contained).m_error.context.
      super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (__return_storage_ptr__->contained).m_error.reason = NoSuchConstant;
      return peVar1;
    }
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&(arginfo->enums).
               super__Vector_base<std::shared_ptr<Enum>,_std::allocator<std::shared_ptr<Enum>_>_>.
               _M_impl.super__Vector_impl_data._M_start =
           *(int *)&(arginfo->enums).
                    super__Vector_base<std::shared_ptr<Enum>,_std::allocator<std::shared_ptr<Enum>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 1;
      UNLOCK();
      if (__libc_single_threaded != '\0') goto LAB_0016518b;
      LOCK();
      *(int *)&(arginfo->enums).
               super__Vector_base<std::shared_ptr<Enum>,_std::allocator<std::shared_ptr<Enum>_>_>.
               _M_impl.super__Vector_impl_data._M_start =
           *(int *)&(arginfo->enums).
                    super__Vector_base<std::shared_ptr<Enum>,_std::allocator<std::shared_ptr<Enum>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 1;
      UNLOCK();
    }
    else {
      *(int *)&(arginfo->enums).
               super__Vector_base<std::shared_ptr<Enum>,_std::allocator<std::shared_ptr<Enum>_>_>.
               _M_impl.super__Vector_impl_data._M_start =
           *(int *)&(arginfo->enums).
                    super__Vector_base<std::shared_ptr<Enum>,_std::allocator<std::shared_ptr<Enum>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 1;
LAB_0016518b:
      *(int *)&(arginfo->enums).
               super__Vector_base<std::shared_ptr<Enum>,_std::allocator<std::shared_ptr<Enum>_>_>.
               _M_impl.super__Vector_impl_data._M_start =
           *(int *)&(arginfo->enums).
                    super__Vector_base<std::shared_ptr<Enum>,_std::allocator<std::shared_ptr<Enum>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 1;
    }
    __return_storage_ptr__->has_value = false;
    (__return_storage_ptr__->contained).m_value = (value_type)hint;
    (__return_storage_ptr__->contained).m_error.context.
    super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)arginfo;
    (__return_storage_ptr__->contained).m_error.reason = NoSuchConstant;
    goto LAB_001651a0;
  }
  if (arginfo == (Arg *)0x0) {
    __return_storage_ptr__->has_value = false;
    (__return_storage_ptr__->contained).m_value = (value_type)hint;
    (__return_storage_ptr__->contained).m_error.context.
    super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (__return_storage_ptr__->contained).m_error.reason = BadArgument;
    return peVar1;
  }
  if (__libc_single_threaded == '\0') {
    LOCK();
    *(int *)&(arginfo->enums).
             super__Vector_base<std::shared_ptr<Enum>,_std::allocator<std::shared_ptr<Enum>_>_>.
             _M_impl.super__Vector_impl_data._M_start =
         *(int *)&(arginfo->enums).
                  super__Vector_base<std::shared_ptr<Enum>,_std::allocator<std::shared_ptr<Enum>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 1;
    UNLOCK();
    if (__libc_single_threaded != '\0') goto LAB_0016514b;
    LOCK();
    *(int *)&(arginfo->enums).
             super__Vector_base<std::shared_ptr<Enum>,_std::allocator<std::shared_ptr<Enum>_>_>.
             _M_impl.super__Vector_impl_data._M_start =
         *(int *)&(arginfo->enums).
                  super__Vector_base<std::shared_ptr<Enum>,_std::allocator<std::shared_ptr<Enum>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 1;
    UNLOCK();
  }
  else {
    *(int *)&(arginfo->enums).
             super__Vector_base<std::shared_ptr<Enum>,_std::allocator<std::shared_ptr<Enum>_>_>.
             _M_impl.super__Vector_impl_data._M_start =
         *(int *)&(arginfo->enums).
                  super__Vector_base<std::shared_ptr<Enum>,_std::allocator<std::shared_ptr<Enum>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 1;
LAB_0016514b:
    *(int *)&(arginfo->enums).
             super__Vector_base<std::shared_ptr<Enum>,_std::allocator<std::shared_ptr<Enum>_>_>.
             _M_impl.super__Vector_impl_data._M_start =
         *(int *)&(arginfo->enums).
                  super__Vector_base<std::shared_ptr<Enum>,_std::allocator<std::shared_ptr<Enum>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 1;
  }
  __return_storage_ptr__->has_value = false;
  (__return_storage_ptr__->contained).m_value = (value_type)hint;
  (__return_storage_ptr__->contained).m_error.context.
  super___shared_ptr<const_SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)arginfo;
  (__return_storage_ptr__->contained).m_error.reason = BadArgument;
LAB_001651a0:
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)arginfo);
  return extraout_RAX;
}

Assistant:

static auto make_expected_error(const shared_ptr<const SyntaxTree>& hint, 
                                const Command::Arg& arginfo) -> expected<const Command::Arg*, MatchFailure>
{
    switch(arginfo.type)
    {
        case ArgType::Param:
            return make_unexpected(MatchFailure{ hint, MatchFailure::BadArgument });
        case ArgType::Integer:
            return make_unexpected(MatchFailure{ hint, MatchFailure::ExpectedInt });
        case ArgType::Float:
            return make_unexpected(MatchFailure{ hint, MatchFailure::ExpectedFloat });
        case ArgType::Label:
            return make_unexpected(MatchFailure{ hint, MatchFailure::NoSuchLabel });
        case ArgType::Constant:
            return make_unexpected(MatchFailure{ hint, MatchFailure::NoSuchConstant });
        case ArgType::TextLabel:
        case ArgType::TextLabel16:
            return make_unexpected(MatchFailure{ hint, MatchFailure::ExpectedTextLabel });
        case ArgType::TextLabel32:
        case ArgType::String:
            return make_unexpected(MatchFailure{ hint, MatchFailure::ExpectedStringLiteral });
        default:
            Unreachable();
    }
}